

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CheckboxFlagsT<long_long>(char *label,longlong *flags,longlong flags_value)

{
  ImGuiItemFlags IVar1;
  ImGuiContext *pIVar2;
  ulong in_RDX;
  ulong *in_RSI;
  bool bVar3;
  ImGuiItemFlags backup_item_flags;
  ImGuiContext *g;
  bool pressed;
  bool any_on;
  bool all_on;
  bool *in_stack_00000100;
  char *in_stack_00000108;
  bool local_1b;
  
  pIVar2 = GImGui;
  bVar3 = (*in_RSI & in_RDX) == in_RDX;
  if ((bVar3) || ((*in_RSI & in_RDX) == 0)) {
    local_1b = Checkbox(in_stack_00000108,in_stack_00000100);
  }
  else {
    IVar1 = GImGui->CurrentItemFlags;
    GImGui->CurrentItemFlags = GImGui->CurrentItemFlags | 0x40;
    local_1b = Checkbox(in_stack_00000108,in_stack_00000100);
    pIVar2->CurrentItemFlags = IVar1;
  }
  if (local_1b != false) {
    if (bVar3) {
      *in_RSI = in_RDX | *in_RSI;
    }
    else {
      *in_RSI = (in_RDX ^ 0xffffffffffffffff) & *in_RSI;
    }
  }
  return local_1b;
}

Assistant:

bool ImGui::CheckboxFlagsT(const char* label, T* flags, T flags_value)
{
    bool all_on = (*flags & flags_value) == flags_value;
    bool any_on = (*flags & flags_value) != 0;
    bool pressed;
    if (!all_on && any_on)
    {
        ImGuiContext& g = *GImGui;
        ImGuiItemFlags backup_item_flags = g.CurrentItemFlags;
        g.CurrentItemFlags |= ImGuiItemFlags_MixedValue;
        pressed = Checkbox(label, &all_on);
        g.CurrentItemFlags = backup_item_flags;
    }
    else
    {
        pressed = Checkbox(label, &all_on);

    }
    if (pressed)
    {
        if (all_on)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }
    return pressed;
}